

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerConnection.cxx
# Opt level: O0

void __thiscall
cmServerPipeConnection::cmServerPipeConnection(cmServerPipeConnection *this,string *name)

{
  cmServerBufferStrategy *this_00;
  string *name_local;
  cmServerPipeConnection *this_local;
  
  this_00 = (cmServerBufferStrategy *)operator_new(0x28);
  cmServerBufferStrategy::cmServerBufferStrategy(this_00);
  cmPipeConnection::cmPipeConnection
            (&this->super_cmPipeConnection,name,(cmConnectionBufferStrategy *)this_00);
  (this->super_cmPipeConnection).super_cmEventBasedConnection.super_cmConnection._vptr_cmConnection
       = (_func_int **)&PTR_WriteData_00bf3000;
  return;
}

Assistant:

cmServerPipeConnection::cmServerPipeConnection(const std::string& name)
  : cmPipeConnection(name, new cmServerBufferStrategy)
{
}